

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> * __thiscall
DistanceGraph::fw_neighbours_by_distance
          (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
           *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t n,int min_links)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  pointer pLVar3;
  _Base_ptr p_Var4;
  vector<int,std::allocator<int>> *this_00;
  ulong uVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  Link *l;
  pointer pLVar8;
  pair<int,_long> local_70;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  fndists;
  
  if (0 < min_links) {
    uVar5 = n;
    if (n < 1) {
      uVar5 = -n;
    }
    pvVar2 = (this->links).
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)(((long)(this->links).
                               super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18)) {
      p_Var1 = &fndists._M_t._M_impl.super__Rb_tree_header;
      fndists._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fndists._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fndists._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pLVar3 = *(pointer *)
                ((long)&pvVar2[uVar5].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data + 8);
      pLVar8 = pvVar2[uVar5].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
               super__Vector_impl_data._M_start;
      fndists._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      fndists._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; pLVar8 != pLVar3; pLVar8 = pLVar8 + 1) {
        if (pLVar8->source == -n) {
          this_00 = (vector<int,std::allocator<int>> *)
                    std::
                    map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&fndists,&pLVar8->dest);
          std::vector<int,std::allocator<int>>::emplace_back<int_const&>(this_00,&pLVar8->dist);
        }
      }
      for (p_Var6 = fndists._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6))
      {
        if ((ulong)(uint)min_links <=
            (ulong)((long)p_Var6[1]._M_left - (long)p_Var6[1]._M_parent >> 2)) {
          std::
          __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
          p_Var4 = p_Var6[1]._M_parent;
          uVar5 = (long)p_Var6[1]._M_left - (long)p_Var4;
          uVar7 = (long)uVar5 >> 2;
          if ((uVar5 & 4) == 0) {
            local_70.first =
                 (*(int *)((long)&p_Var4->_M_color + uVar7 * 2) +
                 *(int *)((long)p_Var4 + uVar7 * 2 + -4)) / 2;
            local_70.second = *(long *)(p_Var6 + 1);
            std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            emplace_back<std::pair<int,long>>
                      ((vector<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                       __return_storage_ptr__,&local_70);
          }
          else {
            std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
            emplace_back<int&,long_const&>
                      ((vector<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                       __return_storage_ptr__,
                       (int *)((long)&p_Var4->_M_color + (uVar7 & 0xfffffffffffffffe) * 2),
                       (long *)(p_Var6 + 1));
          }
        }
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<int,long>*,std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ((__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&fndists._M_t);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int,sgNodeID_t>> DistanceGraph::fw_neighbours_by_distance(sgNodeID_t n, int min_links) const {
    if (min_links<1 or llabs(n)>=links.size()) return {};
    std::map<sgNodeID_t,std::vector<int>> fndists;//neighbour and all distances to it
    std::vector<std::pair<int,sgNodeID_t>> fnd; //median distance and neighbours if with min_links
    //ndists[dest] -> [dist1, dist2, dist3...]
    for (auto &l:links[llabs(n)]){
        if (l.source==-n){
            fndists[l.dest].emplace_back(l.dist);
        }
    }
    //fnd <- [(median2, n1),(median2,n2)...]
    for (auto &fn:fndists){
        if (fn.second.size()>=min_links){
            std::sort(fn.second.begin(),fn.second.end());
            if (fn.second.size()%2==0) fnd.emplace_back(std::make_pair((fn.second[fn.second.size()/2-1]+fn.second[fn.second.size()/2])/2,fn.first));
            else fnd.emplace_back(fn.second[fn.second.size()/2],fn.first);
        }
    }
    std::sort(fnd.begin(),fnd.end());
    return fnd;
}